

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::AsyncifyFlow::AsyncifyFlow
          (AsyncifyFlow *this,ModuleAnalyzer *analyzer,Type pointerType,Name asyncifyMemory)

{
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass).passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__AsyncifyFlow_0111fa78;
  this->analyzer = analyzer;
  (this->pointerType).id = pointerType.id;
  (this->asyncifyMemory).super_IString.str._M_len = asyncifyMemory.super_IString.str._M_len;
  (this->asyncifyMemory).super_IString.str._M_str = asyncifyMemory.super_IString.str._M_str;
  (this->builder)._M_t.
  super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl =
       (AsyncifyBuilder *)0x0;
  this->callIndex = 0;
  return;
}

Assistant:

AsyncifyFlow(ModuleAnalyzer* analyzer, Type pointerType, Name asyncifyMemory)
    : analyzer(analyzer), pointerType(pointerType),
      asyncifyMemory(asyncifyMemory) {}